

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void FinalizeAlloca(ExpressionContext *ctx,VmModule *module,VariableData *variable)

{
  bool bVar1;
  uint uVar2;
  ScopeData *pSVar3;
  uint local_38;
  uint e;
  uint i;
  bool found;
  ScopeData *scope;
  VariableData *pVStack_20;
  uint offset;
  VariableData *variable_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  scope._4_4_ = 0;
  pVStack_20 = variable;
  variable_local = (VariableData *)module;
  module_local = (VmModule *)ctx;
  pSVar3 = anon_unknown.dwarf_c91b1::AllocateScopeSlot
                     (ctx,module,variable->type,(uint *)((long)&scope + 4));
  pVStack_20->offset = scope._4_4_;
  bVar1 = false;
  local_38 = 0;
  uVar2 = SmallArray<VariableData_*,_4U>::size(&pSVar3->allVariables);
  do {
    if (uVar2 <= local_38) {
LAB_0022af33:
      if (!bVar1) {
        if ((pVStack_20->isVmAlloca & 1U) == 0) {
          __assert_fail("variable->isVmAlloca",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x9cb,
                        "void FinalizeAlloca(ExpressionContext &, VmModule *, VariableData *)");
        }
        SmallArray<VariableData_*,_4U>::push_back(&pSVar3->variables,&stack0xffffffffffffffe0);
        SmallArray<VariableData_*,_4U>::push_back(&pSVar3->allVariables,&stack0xffffffffffffffe0);
        SmallArray<VariableData_*,_128U>::push_back
                  ((SmallArray<VariableData_*,_128U> *)(module_local[1].tempUsers.little + 0x2e),
                   &stack0xffffffffffffffe0);
      }
      return;
    }
    if ((pSVar3->allVariables).data[local_38] == pVStack_20) {
      bVar1 = true;
      goto LAB_0022af33;
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

void FinalizeAlloca(ExpressionContext &ctx, VmModule *module, VariableData *variable)
{
	unsigned offset = 0;
	ScopeData *scope = AllocateScopeSlot(ctx, module, variable->type, offset);

	variable->offset = offset;

	bool found = false;

	for(unsigned i = 0, e = scope->allVariables.size(); i < e; i++)
	{
		if(scope->allVariables.data[i] == variable)
		{
			found = true;
			break;
		}
	}

	if(!found)
	{
		assert(variable->isVmAlloca);

		scope->variables.push_back(variable);
		scope->allVariables.push_back(variable);
		ctx.variables.push_back(variable);
	}
}